

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  bitset_container_t *c;
  _Bool _Var1;
  uint8_t typecode;
  uint uVar2;
  uint uVar3;
  int iVar4;
  roaring_array_t *ra;
  array_container_t *src;
  run_container_t *c_00;
  roaring_bitmap_t *prVar5;
  uint16_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ushort stopping_key;
  uint uVar9;
  uint8_t local_55;
  uint local_54;
  bitset_container_t *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (range_end <= range_start) {
    prVar5 = roaring_bitmap_copy(x1);
    return prVar5;
  }
  uVar7 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar7 = range_end;
  }
  ra = &roaring_bitmap_create()->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar8 = uVar7 - 1;
  uVar9 = (uint)(uVar8 >> 0x10);
  stopping_key = (ushort)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,stopping_key,(_Bool)((x1->high_low_container).flags & 1));
  local_54 = uVar9 & 0xffff;
  uVar6 = (uint16_t)range_start;
  if ((uint16_t)(uVar8 >> 0x10) == stopping_key) {
    insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar6,(uint16_t)uVar8);
    uVar6 = (uint16_t)local_54;
  }
  else {
    if (uVar6 != 0) {
      insert_flipped_container(ra,&x1->high_low_container,stopping_key,uVar6,0xffff);
      stopping_key = stopping_key + 1;
    }
    local_38 = uVar8 & 0xffff;
    local_44 = (uVar9 & 0xffff) - (uint)(local_38 != 0xffff) & 0xffff;
    local_40 = uVar8;
    for (uVar9 = (uint)stopping_key; uVar9 <= local_44; uVar9 = uVar9 + 1) {
      uVar6 = (uint16_t)uVar9;
      uVar2 = ra_get_index(&x1->high_low_container,uVar6);
      uVar3 = ra_get_index(ra,uVar6);
      if ((int)uVar2 < 0) {
        c_00 = run_container_create_range(0,0x10000);
        ra_insert_new_key_value_at(ra,~uVar3,uVar6,c_00,'\x03');
      }
      else {
        local_55 = (x1->high_low_container).typecodes[uVar2 & 0xffff];
        src = (array_container_t *)
              container_unwrap_shared((x1->high_low_container).containers[uVar2 & 0xffff],&local_55)
        ;
        local_50 = (bitset_container_t *)0x0;
        if (local_55 == '\x03') {
          iVar4 = run_container_negation((run_container_t *)src,&local_50);
          typecode = (uint8_t)iVar4;
        }
        else if (local_55 == '\x02') {
          local_50 = bitset_container_create();
          array_container_negation(src,local_50);
          typecode = '\x01';
        }
        else {
          if (local_55 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1824,
                          "container_t *container_not(const container_t *, uint8_t, uint8_t *)");
          }
          _Var1 = bitset_container_negation((bitset_container_t *)src,&local_50);
          typecode = '\x02' - _Var1;
        }
        c = local_50;
        iVar4 = container_get_cardinality(local_50,typecode);
        if (iVar4 == 0) {
          container_free(c,typecode);
          uVar8 = local_40;
        }
        else {
          ra_insert_new_key_value_at(ra,~uVar3,uVar6,c,typecode);
          uVar8 = local_40;
        }
      }
    }
    uVar6 = (uint16_t)local_54;
    if ((int)local_38 != 0xffff) {
      insert_flipped_container(ra,&x1->high_low_container,uVar6,0,(uint16_t)uVar8);
    }
  }
  ra_append_copies_after
            (ra,&x1->high_low_container,uVar6,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container, hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}